

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_ptr.hpp
# Opt level: O1

Ptr<Catch::CumulativeReporterBase::SectionNode> * __thiscall
Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
          (Ptr<Catch::CumulativeReporterBase::SectionNode> *this,
          Ptr<Catch::CumulativeReporterBase::SectionNode> *other)

{
  SectionNode *pSVar1;
  SectionNode *pSVar2;
  
  pSVar1 = other->m_p;
  if (pSVar1 != (SectionNode *)0x0) {
    (*(pSVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [2])(pSVar1);
  }
  pSVar2 = this->m_p;
  this->m_p = pSVar1;
  if (pSVar2 != (SectionNode *)0x0) {
    (*(pSVar2->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [3])();
  }
  return this;
}

Assistant:

Ptr& operator = ( Ptr const& other ){
            Ptr temp( other );
            swap( temp );
            return *this;
        }